

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall dg::llvmdg::legacy::Block::Block(Block *this,BasicBlock *b,bool callReturn)

{
  byte in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::vector
            ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *)
             0x21b3d1);
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         *)0x21b3df);
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         *)0x21b3ed);
  *(byte *)(in_RDI + 0x10) = in_DL & 1;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  std::
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  ::map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         *)0x21b414);
  std::
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  ::map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         *)0x21b425);
  std::
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  ::map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         *)0x21b436);
  return;
}

Assistant:

Block(const llvm::BasicBlock *b, bool callReturn = false)
            : _llvm_blk(b), callReturn(callReturn) {}